

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fms.c
# Opt level: O1

int FmsMetaDataSetIntegers
              (FmsMetaData mdata,char *mdata_name,FmsIntType int_type,FmsInt size,void **data)

{
  int iVar1;
  void *__ptr;
  char *pcVar2;
  
  if (mdata == (FmsMetaData)0x0) {
    iVar1 = 1;
  }
  else {
    iVar1 = 2;
    if (((int_type < FMS_NUM_INT_TYPES) && (iVar1 = 3, size == 0 || data != (void **)0x0)) &&
       (iVar1 = FmsMetaDataClear(mdata), iVar1 == 0)) {
      if (size == 0) {
        __ptr = (void *)0x0;
      }
      else {
        __ptr = malloc(FmsIntTypeSize[int_type] * size);
      }
      iVar1 = 4;
      if ((size == 0) || (__ptr != (void *)0x0)) {
        iVar1 = 0;
        if (mdata_name == (char *)0x0) {
          pcVar2 = (char *)0x0;
        }
        else {
          pcVar2 = strdup(mdata_name);
          if (pcVar2 == (char *)0x0) {
            free(__ptr);
            return 4;
          }
        }
        mdata->name = pcVar2;
        mdata->md_type = FMS_INTEGER;
        (mdata->sub_type).int_type = int_type;
        mdata->num_entries = size;
        mdata->data = __ptr;
        *data = __ptr;
      }
    }
  }
  return iVar1;
}

Assistant:

int FmsMetaDataSetIntegers(FmsMetaData mdata, const char *mdata_name,
                           FmsIntType int_type, FmsInt size, void **data) {
  if (!mdata) { E_RETURN(1); }
  if (int_type >= FMS_NUM_INT_TYPES) { E_RETURN(2); }
  if (size && !data) { E_RETURN(3); }
  int err = FmsMetaDataClear(mdata);
  if (err) { E_RETURN(err); }
  const size_t sizeof_int_type = FmsIntTypeSize[int_type];
  void *md_data = size ? malloc(size*sizeof_int_type) : NULL;
  if (size && md_data == NULL) { E_RETURN(4); }
  // On error, call free(md_data)
  // Update mdata
  if (FmsCopyString(mdata_name, &mdata->name)) { free(md_data); E_RETURN(4); }
  mdata->md_type = FMS_INTEGER;
  mdata->sub_type.int_type = int_type;
  mdata->num_entries = size;
  mdata->data = md_data;
  *data = md_data;
  return 0;
}